

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timernu.c
# Opt level: O2

void shutdown_timers(void)

{
  _al_vector_free(&active_timers);
  if (timer_thread != (_AL_THREAD *)0x0) {
    destroy_thread = 1;
    al_lock_mutex(timers_mutex);
    al_signal_cond(timer_cond);
    al_unlock_mutex(timers_mutex);
    _al_thread_join(timer_thread);
  }
  al_free_with_context
            (timer_thread,0xae,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/timernu.c"
             ,"shutdown_timers");
  timer_thread = (_AL_THREAD *)0x0;
  al_destroy_mutex(timers_mutex);
  al_destroy_cond(timer_cond);
  return;
}

Assistant:

static void shutdown_timers(void)
{
   ASSERT(_al_vector_size(&active_timers) == 0);

   _al_vector_free(&active_timers);

   if (timer_thread != NULL) {
      destroy_thread = true;
      al_lock_mutex(timers_mutex);
      al_signal_cond(timer_cond);
      al_unlock_mutex(timers_mutex);
      _al_thread_join(timer_thread);
   }

   al_free(timer_thread);

   timer_thread = NULL;

   al_destroy_mutex(timers_mutex);

   al_destroy_cond(timer_cond);
}